

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O1

void rx__uint_assess_comparison
               (rx_context *context,rx__uint x1,rx__uint x2,rx__op op,char *expr1,char *expr2,
               char *file,int line,rx_severity severity,char *failure_fmt,...)

{
  bool bVar1;
  rx_status rVar2;
  char *s;
  char *pcVar3;
  char *file_00;
  char *file_01;
  bool bVar4;
  char *in_stack_ffffffffffffffa8;
  size_t local_48;
  rx_context *local_40;
  size_t local_38;
  
  if (context == (rx_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x160a,
                  "void rx__uint_assess_comparison(struct rx_context *, rx__uint, rx__uint, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (_op == 0) {
    __assert_fail("expr1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x160b,
                  "void rx__uint_assess_comparison(struct rx_context *, rx__uint, rx__uint, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (expr1 == (char *)0x0) {
    __assert_fail("expr2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x160c,
                  "void rx__uint_assess_comparison(struct rx_context *, rx__uint, rx__uint, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  bVar4 = x1 == x2;
  file_01 = (char *)(ulong)bVar4;
  if (bVar4) {
    s = (char *)0x0;
    pcVar3 = (char *)0x0;
    goto LAB_001042f4;
  }
  s = (char *)0x0;
  pcVar3 = (char *)0x0;
  local_40 = context;
  rVar2 = rx__str_initialize(&local_48,(char *)0x0,"`%s` is expected to be %s `%s`",_op,"equal to",
                             expr1);
  bVar1 = false;
  if (rVar2 == RX_SUCCESS) {
    local_38 = local_48;
    s = (char *)malloc(local_48);
    if (s == (char *)0x0) {
      s = (char *)0x0;
      rx__log(RX_LOG_LEVEL_ALL,pcVar3,0x1638,"failed to allocate the string (%lu bytes)\n",local_38)
      ;
    }
    else {
      pcVar3 = s;
      rVar2 = rx__str_initialize(&local_48,s,"`%s` is expected to be %s `%s`",_op,"equal to",expr1);
      if (rVar2 == RX_SUCCESS) {
        bVar1 = true;
        goto LAB_00104204;
      }
      free(s);
    }
    bVar1 = false;
  }
LAB_00104204:
  if (!bVar1) {
    s = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,pcVar3,0x1642,
            "failed to create the failure message for the unsigned integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
            ,(ulong)expr2 & 0xffffffff);
  }
  pcVar3 = (char *)0x0;
  file_00 = (char *)0x0;
  rVar2 = rx__str_initialize(&local_48,(char *)0x0,"%lu %s %lu",x1,"==",x2);
  bVar1 = false;
  if (rVar2 == RX_SUCCESS) {
    pcVar3 = (char *)malloc(local_48);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
      rx__log(RX_LOG_LEVEL_ALL,file_00,0x164c,"failed to allocate the string (%lu bytes)\n",local_48
             );
    }
    else {
      file_00 = pcVar3;
      rVar2 = rx__str_initialize(&local_48,pcVar3,"%lu %s %lu",x1,"==",x2);
      if (rVar2 == RX_SUCCESS) {
        bVar1 = true;
        goto LAB_001042c5;
      }
      free(pcVar3);
    }
    bVar1 = false;
  }
LAB_001042c5:
  context = local_40;
  if (!bVar1) {
    pcVar3 = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,file_00,0x1652,
            "failed to create the diagnostic message for the unsigned integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
            ,(ulong)expr2 & 0xffffffff);
    context = local_40;
  }
LAB_001042f4:
  rVar2 = rx_handle_test_result
                    (context,(uint)bVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
                     ,(int)expr2,(rx_severity)s,pcVar3,in_stack_ffffffffffffffa8);
  if (rVar2 != RX_SUCCESS) {
    rx__log(RX_LOG_LEVEL_ALL,file_01,0x165d,
            "failed to handle the test result for the unsigned integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
            ,(ulong)expr2 & 0xffffffff);
  }
  free(s);
  free(pcVar3);
  if (x1 != x2) {
    longjmp((__jmp_buf_tag *)context,1);
  }
  return;
}

Assistant:

static void
rx__uint_assess_comparison(struct rx_context *context,
                           rx__uint x1,
                           rx__uint x2,
                           enum rx__op op,
                           const char *expr1,
                           const char *expr2,
                           const char *file,
                           int line,
                           enum rx_severity severity,
                           const char *failure_fmt,
                           ...)
{
    int result;
    char *failure_msg;
    char *diagnostic_msg;

    RX_ASSERT(context != NULL);
    RX_ASSERT(expr1 != NULL);
    RX_ASSERT(expr2 != NULL);
    RX_ASSERT(file != NULL);

    switch (op) {
        case RX__OP_EQUAL:
            result = x1 == x2;
            break;
        case RX__OP_NOT_EQUAL:
            result = x1 != x2;
            break;
        case RX__OP_GREATER:
            result = x1 > x2;
            break;
        case RX__OP_LESSER:
            result = x1 < x2;
            break;
        case RX__OP_GREATER_OR_EQUAL:
            result = x1 >= x2;
            break;
        case RX__OP_LESSER_OR_EQUAL:
            result = x1 <= x2;
            break;
        default:
            RX_ASSERT(0);
            result = 0;
            break;
    }

    if (result) {
        failure_msg = NULL;
        diagnostic_msg = NULL;
    } else {
        enum rx_status status;
        const char *op_symbol;

        if (failure_fmt == NULL) {
            const char *op_name;

            rx__op_get_name(&op_name, op);
            RX__STR_CREATE_3(status,
                             failure_msg,
                             "`%s` is expected to be %s `%s`",
                             expr1,
                             op_name,
                             expr2);
        } else {
            RX__STR_CREATE_VA_LIST(status, failure_msg, failure_fmt);
        }

        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the failure message for "
                            "the unsigned integer comparison test located at "
                            "%s:%d\n",
                            file,
                            line);
            failure_msg = NULL;
        }

        rx__op_get_symbol(&op_symbol, op);
        RX__STR_CREATE_3(status,
                         diagnostic_msg,
                         "%lu %s %lu",
                         (unsigned long)x1,
                         op_symbol,
                         (unsigned long)x2);
        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the diagnostic message for "
                            "the unsigned integer comparison test located at "
                            "%s:%d\n",
                            file,
                            line);
            diagnostic_msg = NULL;
        }
    }

    if (rx_handle_test_result(
            context, result, file, line, severity, failure_msg, diagnostic_msg)
        != RX_SUCCESS) {
        RX__LOG_DEBUG_2("failed to handle the test result for the unsigned "
                        "integer comparison test located at %s:%d\n",
                        file,
                        line);
    }

    RX_FREE(failure_msg);
    RX_FREE(diagnostic_msg);

    if (!result && severity == RX_FATAL) {
        rx_abort(context);
    }
}